

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_diag.c
# Opt level: O0

char * CVDiagGetReturnFlagName(long flag)

{
  char *__s;
  undefined8 in_RDI;
  char *name;
  
  __s = (char *)malloc(0x1e);
  switch(in_RDI) {
  case 0:
    sprintf(__s,"CVDIAG_SUCCESS");
    break;
  default:
    sprintf(__s,"NONE");
    break;
  case 0xfffffffffffffff9:
    sprintf(__s,"CVDIAG_RHSFUNC_RECVR");
    break;
  case 0xfffffffffffffffa:
    sprintf(__s,"CVDIAG_RHSFUNC_UNRECVR");
    break;
  case 0xfffffffffffffffb:
    sprintf(__s,"CVDIAG_INV_FAIL");
    break;
  case 0xfffffffffffffffc:
    sprintf(__s,"CVDIAG_MEM_FAIL");
    break;
  case 0xfffffffffffffffd:
    sprintf(__s,"CVDIAG_ILL_INPUT");
    break;
  case 0xfffffffffffffffe:
    sprintf(__s,"CVDIAG_LMEM_NULL");
    break;
  case 0xffffffffffffffff:
    sprintf(__s,"CVDIAG_MEM_NULL");
  }
  return __s;
}

Assistant:

char* CVDiagGetReturnFlagName(long int flag)
{
  char* name;

  name = (char*)malloc(30 * sizeof(char));

  switch (flag)
  {
  case CVDIAG_SUCCESS: sprintf(name, "CVDIAG_SUCCESS"); break;
  case CVDIAG_MEM_NULL: sprintf(name, "CVDIAG_MEM_NULL"); break;
  case CVDIAG_LMEM_NULL: sprintf(name, "CVDIAG_LMEM_NULL"); break;
  case CVDIAG_ILL_INPUT: sprintf(name, "CVDIAG_ILL_INPUT"); break;
  case CVDIAG_MEM_FAIL: sprintf(name, "CVDIAG_MEM_FAIL"); break;
  case CVDIAG_INV_FAIL: sprintf(name, "CVDIAG_INV_FAIL"); break;
  case CVDIAG_RHSFUNC_UNRECVR: sprintf(name, "CVDIAG_RHSFUNC_UNRECVR"); break;
  case CVDIAG_RHSFUNC_RECVR: sprintf(name, "CVDIAG_RHSFUNC_RECVR"); break;
  default: sprintf(name, "NONE");
  }

  return (name);
}